

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O0

int mpt::type_properties<mpt::io::buffer::metatype_*>::id(bool obtain)

{
  type_traits *traits;
  undefined4 local_c;
  bool obtain_local;
  
  if (id::_valtype < 1) {
    if (obtain) {
      traits = type_properties<mpt::io::buffer::metatype_*>::traits();
      id::_valtype = type_traits::add(traits);
      local_c = id::_valtype;
    }
    else {
      local_c = -3;
    }
  }
  else {
    local_c = id::_valtype;
  }
  return local_c;
}

Assistant:

static int id(bool obtain = false) {
		static int _valtype = 0;
		if (_valtype > 0) {
			return _valtype;
		}
		if (!obtain) {
			return BadType;
		}
		return _valtype = type_traits::add(*traits());
	}